

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svectorbase.h
# Opt level: O2

SVectorBase<double> * __thiscall
soplex::SVectorBase<double>::operator*=(SVectorBase<double> *this,double *x)

{
  int iVar1;
  Nonzero<double> *pNVar2;
  bool bVar3;
  
  iVar1 = this->memused;
  pNVar2 = this->m_elem;
  while (bVar3 = iVar1 != 0, iVar1 = iVar1 + -1, bVar3) {
    pNVar2->val = *x * pNVar2->val;
    pNVar2 = pNVar2 + 1;
  }
  return this;
}

Assistant:

SVectorBase<R>& operator*=(const R& x)
   {
      int n = size();
      Nonzero<R>* e = m_elem;

      assert(x != 0);

      while(n--)
      {
         e->val *= x;
         e++;
      }

      return *this;
   }